

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumTextureHandle __thiscall
pbrt::SpectrumTextureHandle::Create
          (SpectrumTextureHandle *this,string *name,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc,bool gpu)

{
  bool bVar1;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  in_RAX;
  SpectrumCheckerboardTexture *pSVar2;
  ulong uVar3;
  SpectrumBilerpTexture *pSVar4;
  TextureParameterDictionary *loc_00;
  FileLoc *loc_01;
  FileLoc *loc_02;
  FileLoc *loc_03;
  FileLoc *loc_04;
  Transform *pTVar5;
  char *fmt;
  long in_FS_OFFSET;
  SpectrumTextureHandle local_38;
  
  loc_00 = parameters;
  pTVar5 = (Transform *)name;
  local_38.
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
           )(TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )in_RAX.bits;
  bVar1 = std::operator==(name,"constant");
  if (bVar1) {
    pSVar2 = (SpectrumCheckerboardTexture *)
             SpectrumConstantTexture::Create(pTVar5,parameters,loc_01,alloc);
    uVar3 = 0x7000000000000;
LAB_0039a2a2:
    local_38.
    super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(uVar3 | (ulong)pSVar2);
  }
  else {
    pTVar5 = (Transform *)0x28494c5;
    bVar1 = std::operator==(name,"scale");
    if (!bVar1) {
      pTVar5 = (Transform *)name;
      bVar1 = std::operator==(name,"mix");
      if (bVar1) {
        pSVar2 = (SpectrumCheckerboardTexture *)
                 SpectrumMixTexture::Create(pTVar5,parameters,loc_02,alloc);
        uVar3 = 0x5000000000000;
      }
      else {
        bVar1 = std::operator==(name,"bilerp");
        if (bVar1) {
          pSVar4 = SpectrumBilerpTexture::Create(renderFromTexture,parameters,loc,alloc);
          local_38.
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits = (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                   )((ulong)pSVar4 | 0x8000000000000);
          goto LAB_0039a2cf;
        }
        bVar1 = std::operator==(name,"imagemap");
        if (bVar1) {
          if (gpu) {
            LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.h"
                     ,0x2e3,"GPUSpectrumImageTexture::Create called in non-GPU configuration.");
          }
          pSVar2 = (SpectrumCheckerboardTexture *)
                   SpectrumImageTexture::Create(renderFromTexture,parameters,loc,alloc);
          uVar3 = 0x3000000000000;
        }
        else {
          bVar1 = std::operator==(name,"checkerboard");
          if (bVar1) {
            pSVar2 = SpectrumCheckerboardTexture::Create(renderFromTexture,parameters,loc,alloc);
            uVar3 = 0x9000000000000;
          }
          else {
            bVar1 = std::operator==(name,"dots");
            if (bVar1) {
              pSVar2 = (SpectrumCheckerboardTexture *)
                       SpectrumDotsTexture::Create(renderFromTexture,parameters,loc,alloc);
              uVar3 = 0xb000000000000;
            }
            else {
              bVar1 = std::operator==(name,"marble");
              if (bVar1) {
                pSVar2 = (SpectrumCheckerboardTexture *)
                         MarbleTexture::Create(renderFromTexture,parameters,loc_03,alloc);
                uVar3 = 0xa000000000000;
              }
              else {
                pTVar5 = (Transform *)name;
                bVar1 = std::operator==(name,"ptex");
                if (!bVar1) {
                  fmt = "%s: spectrum texture type unknown.";
                  goto LAB_0039a473;
                }
                if (gpu) {
                  ErrorExit(loc,"ptex texture is not supported on the GPU.");
                }
                pSVar2 = (SpectrumCheckerboardTexture *)
                         SpectrumPtexTexture::Create(pTVar5,parameters,loc_04,alloc);
                uVar3 = 0xc000000000000;
              }
            }
          }
        }
      }
      goto LAB_0039a2a2;
    }
    SpectrumScaledTexture::Create
              ((SpectrumScaledTexture *)&local_38,pTVar5,parameters,(FileLoc *)loc_00,alloc);
  }
LAB_0039a2cf:
  (this->
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  ).bits = (uintptr_t)local_38;
  if (((ulong)local_38.
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) != 0) {
    *(long *)(in_FS_OFFSET + -0x178) = *(long *)(in_FS_OFFSET + -0x178) + 1;
    return (SpectrumTextureHandle)
           (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
            )this;
  }
  fmt = "%s: unable to create texture.";
LAB_0039a473:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

SpectrumTextureHandle SpectrumTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc,
    bool gpu) {
    SpectrumTextureHandle tex;
    if (name == "constant")
        tex = SpectrumConstantTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "scale")
        tex = SpectrumScaledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "mix")
        tex = SpectrumMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "bilerp")
        tex = SpectrumBilerpTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUSpectrumImageTexture::Create(renderFromTexture, parameters, loc,
                                                  alloc);
        else
            tex = SpectrumImageTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else if (name == "checkerboard")
        tex = SpectrumCheckerboardTexture::Create(renderFromTexture, parameters, loc,
                                                  alloc);
    else if (name == "dots")
        tex = SpectrumDotsTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "marble")
        tex = MarbleTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = SpectrumPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: spectrum texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}